

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O1

TestCase *
vkt::createFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
          (TestContext *testCtx,TestNodeType type,string *name,string *desc,Function initPrograms,
          Function testFunction,InstanceContext *arg0)

{
  InstanceFactory1<vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>,_vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args,_vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>_>
  *this;
  FunctionPrograms1<vkt::SpirVAssembly::InstanceContext> local_200;
  InstanceContext local_1f8;
  Args local_118;
  
  this = (InstanceFactory1<vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>,_vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args,_vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>_>
          *)operator_new(0x160);
  local_200.m_func = initPrograms;
  SpirVAssembly::InstanceContext::InstanceContext(&local_1f8,arg0);
  local_118.func = testFunction;
  SpirVAssembly::InstanceContext::InstanceContext(&local_118.arg0,&local_1f8);
  InstanceFactory1<vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>,_vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args,_vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>_>
  ::InstanceFactory1(this,testCtx,type,name,desc,&local_200,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.arg0.failMessageTemplate._M_dataplus._M_p !=
      &local_118.arg0.failMessageTemplate.field_2) {
    operator_delete(local_118.arg0.failMessageTemplate._M_dataplus._M_p,
                    local_118.arg0.failMessageTemplate.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_118.arg0.specConstants._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_118.arg0.testCodeFragments._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&local_118.arg0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.failMessageTemplate._M_dataplus._M_p != &local_1f8.failMessageTemplate.field_2) {
    operator_delete(local_1f8.failMessageTemplate._M_dataplus._M_p,
                    local_1f8.failMessageTemplate.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_1f8.specConstants._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1f8.testCodeFragments._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&local_1f8);
  return &this->super_TestCase;
}

Assistant:

TestCase* createFunctionCaseWithPrograms (tcu::TestContext&								testCtx,
										  tcu::TestNodeType								type,
										  const std::string&							name,
										  const std::string&							desc,
										  typename FunctionPrograms1<Arg0>::Function	initPrograms,
										  typename FunctionInstance1<Arg0>::Function	testFunction,
										  Arg0											arg0)
{
	return new InstanceFactory1<FunctionInstance1<Arg0>, typename FunctionInstance1<Arg0>::Args, FunctionPrograms1<Arg0> >(
		testCtx, type, name, desc, FunctionPrograms1<Arg0>(initPrograms), typename FunctionInstance1<Arg0>::Args(testFunction, arg0));
}